

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Read.h
# Opt level: O2

void __thiscall Read::Read(Read *this,string *name,Token *token)

{
  string sStack_38;
  
  std::__cxx11::string::string((string *)&sStack_38,(string *)name);
  AST::ASTNode::ASTNode(&this->super_ASTNode,&sStack_38,token);
  std::__cxx11::string::~string((string *)&sStack_38);
  (this->super_ASTNode)._vptr_ASTNode = (_func_int **)&PTR_accept_00145a28;
  return;
}

Assistant:

Read(std::string name, Token *token) : ASTNode(std::move(name), token) {}